

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLapsp.c
# Opt level: O0

void RDL_deleteAPSP(RDL_sPathInfo *info,uint V)

{
  uint local_18;
  uint i;
  uint V_local;
  RDL_sPathInfo *info_local;
  
  RDL_delete2DUIntArray(info->pred,V);
  RDL_delete2DUIntArray(info->dist,V);
  RDL_delete2DCharArray(info->reachable,V);
  for (local_18 = 0; local_18 < V; local_18 = local_18 + 1) {
    RDL_deleteGraph(info->dPaths[local_18]);
  }
  free(info->dPaths);
  free(info);
  return;
}

Assistant:

void RDL_deleteAPSP(RDL_sPathInfo *info, unsigned V)
{
  unsigned i;
  RDL_delete2DUIntArray(info->pred, V);
  RDL_delete2DUIntArray(info->dist, V);
  RDL_delete2DCharArray(info->reachable, V);
  for(i=0; i<V; ++i)
  {
    RDL_deleteGraph(info->dPaths[i]);
  }
  free(info->dPaths);
  free(info);
}